

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::UnaryScatter<duckdb::SumState<long>,int,duckdb::IntegerSumOperation>
               (Vector *input,Vector *states,AggregateInputData *aggr_input_data,idx_t count)

{
  long *plVar1;
  int *piVar2;
  undefined1 *puVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  idx_t iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  idx_t iVar13;
  idx_t iVar14;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat sdata;
  long *local_b8;
  long local_b0;
  long local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  long *local_70;
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  if ((*input == (Vector)0x2) && (*states == (Vector)0x2)) {
    if ((*(byte **)(input + 0x28) == (byte *)0x0) || ((**(byte **)(input + 0x28) & 1) != 0)) {
      piVar2 = *(int **)(input + 0x20);
      puVar3 = (undefined1 *)**(undefined8 **)(states + 0x20);
      *puVar3 = 1;
      plVar1 = (long *)(puVar3 + 8);
      *plVar1 = *plVar1 + (long)*piVar2 * count;
    }
  }
  else if (*input == (Vector)0x0 && *states == (Vector)0x0) {
    lVar4 = *(long *)(input + 0x20);
    lVar5 = *(long *)(states + 0x20);
    FlatVector::VerifyFlatVector(input);
    lVar6 = *(long *)(input + 0x28);
    if (lVar6 == 0) {
      if (count != 0) {
        iVar8 = 0;
        do {
          puVar3 = *(undefined1 **)(lVar5 + iVar8 * 8);
          *puVar3 = 1;
          plVar1 = (long *)(puVar3 + 8);
          *plVar1 = *plVar1 + (long)*(int *)(lVar4 + iVar8 * 4);
          iVar8 = iVar8 + 1;
        } while (count != iVar8);
      }
    }
    else if (0x3f < count + 0x3f) {
      uVar9 = 0;
      uVar10 = 0;
      do {
        uVar7 = *(ulong *)(lVar6 + uVar9 * 8);
        uVar12 = uVar10 + 0x40;
        if (count <= uVar10 + 0x40) {
          uVar12 = count;
        }
        uVar11 = uVar12;
        if (uVar7 != 0) {
          uVar11 = uVar10;
          if (uVar7 == 0xffffffffffffffff) {
            if (uVar10 < uVar12) {
              do {
                puVar3 = *(undefined1 **)(lVar5 + uVar11 * 8);
                *puVar3 = 1;
                plVar1 = (long *)(puVar3 + 8);
                *plVar1 = *plVar1 + (long)*(int *)(lVar4 + uVar11 * 4);
                uVar11 = uVar11 + 1;
              } while (uVar12 != uVar11);
            }
          }
          else if (uVar10 < uVar12) {
            uVar11 = 0;
            do {
              if ((uVar7 >> (uVar11 & 0x3f) & 1) != 0) {
                puVar3 = *(undefined1 **)(lVar5 + uVar10 * 8 + uVar11 * 8);
                *puVar3 = 1;
                plVar1 = (long *)(puVar3 + 8);
                *plVar1 = *plVar1 + (long)*(int *)(lVar4 + uVar10 * 4 + uVar11 * 4);
              }
              uVar11 = uVar11 + 1;
            } while ((uVar10 - uVar12) + uVar11 != 0);
            uVar11 = uVar10 + uVar11;
          }
        }
        uVar9 = uVar9 + 1;
        uVar10 = uVar11;
      } while (uVar9 != count + 0x3f >> 6);
    }
  }
  else {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_b8);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_70);
    duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
    duckdb::Vector::ToUnifiedFormat((ulong)states,(UnifiedVectorFormat *)count);
    if (local_a8 == 0) {
      if (count != 0) {
        lVar4 = *local_b8;
        lVar5 = *local_70;
        iVar8 = 0;
        do {
          iVar13 = iVar8;
          if (lVar4 != 0) {
            iVar13 = (idx_t)*(uint *)(lVar4 + iVar8 * 4);
          }
          iVar14 = iVar8;
          if (lVar5 != 0) {
            iVar14 = (idx_t)*(uint *)(lVar5 + iVar8 * 4);
          }
          puVar3 = *(undefined1 **)(local_68 + iVar14 * 8);
          *puVar3 = 1;
          plVar1 = (long *)(puVar3 + 8);
          *plVar1 = *plVar1 + (long)*(int *)(local_b0 + iVar13 * 4);
          iVar8 = iVar8 + 1;
        } while (count != iVar8);
      }
    }
    else if (count != 0) {
      lVar4 = *local_b8;
      lVar5 = *local_70;
      iVar8 = 0;
      do {
        iVar13 = iVar8;
        if (lVar4 != 0) {
          iVar13 = (idx_t)*(uint *)(lVar4 + iVar8 * 4);
        }
        iVar14 = iVar8;
        if (lVar5 != 0) {
          iVar14 = (idx_t)*(uint *)(lVar5 + iVar8 * 4);
        }
        if ((*(ulong *)(local_a8 + (iVar13 >> 6) * 8) >> (iVar13 & 0x3f) & 1) != 0) {
          puVar3 = *(undefined1 **)(local_68 + iVar14 * 8);
          *puVar3 = 1;
          plVar1 = (long *)(puVar3 + 8);
          *plVar1 = *plVar1 + (long)*(int *)(local_b0 + iVar13 * 4);
        }
        iVar8 = iVar8 + 1;
      } while (count != iVar8);
    }
    if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
    }
    if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
    }
    if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
    }
    if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
    }
  }
  return;
}

Assistant:

static void UnaryScatter(Vector &input, Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				// constant NULL input in function that ignores NULL values
				return;
			}
			// regular constant: get first state
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(**sdata, *idata, input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (input.GetVectorType() == VectorType::FLAT_VECTOR &&
		           states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			UnaryFlatLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, sdata, FlatVector::Validity(input),
			                                          count);
#endif
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			UnaryScatterLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                             aggr_input_data, (STATE_TYPE **)sdata.data, *idata.sel,
			                                             *sdata.sel, idata.validity, count);
		}
	}